

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O1

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  uint uVar1;
  undefined1 auVar2 [16];
  char cVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  bool bVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  U64 vStepLog;
  
  uVar12 = 0xb;
  if (tableLog != 0) {
    uVar12 = tableLog;
  }
  if (uVar12 < 5) {
    return 0xffffffffffffffff;
  }
  if (0xc < uVar12) {
    return 0xffffffffffffffd4;
  }
  uVar9 = 0x1f;
  if ((uint)total != 0) {
    for (; (uint)total >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar5 = (uVar9 ^ 0xffffffe0) + 0x21;
  uVar9 = 0x1f;
  if (maxSymbolValue != 0) {
    for (; maxSymbolValue >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar9 = (uVar9 ^ 0xffffffe0) + 0x22;
  if (uVar5 < uVar9) {
    uVar9 = uVar5;
  }
  if (uVar12 < uVar9) {
    return 0xffffffffffffffff;
  }
  bVar4 = (byte)uVar12;
  cVar3 = -bVar4;
  bVar7 = cVar3 + 0x3e;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = total;
  iVar16 = 1 << (bVar4 & 0x1f);
  uVar13 = 0;
  uVar6 = 0;
  uVar9 = 0;
  iVar17 = iVar16;
  do {
    uVar19 = (ulong)uVar9;
    uVar11 = (ulong)count[uVar19];
    if (uVar11 == total) {
      return 0;
    }
    uVar5 = (uint)(total >> (bVar4 & 0x3f));
    if (uVar11 == 0) {
      normalizedCounter[uVar19] = 0;
    }
    else if (uVar5 < count[uVar19]) {
      uVar11 = uVar11 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar2,0);
      uVar15 = uVar11 >> (bVar7 & 0x3f);
      if ((uVar15 & 0xfff8) == 0) {
        uVar15 = (ulong)((int)uVar15 +
                        (uint)((ulong)FSE_normalizeCount::rtbTable[uVar15 & 0xffff] <<
                               (cVar3 + 0x2aU & 0x3f) <
                              uVar11 - ((uVar15 & 0xffff) << (bVar7 & 0x3f))));
      }
      uVar8 = (ushort)uVar15;
      if ((ushort)uVar13 < uVar8) {
        uVar6 = uVar19;
      }
      if ((ushort)uVar13 < uVar8) {
        uVar13 = uVar15 & 0xffff;
      }
      normalizedCounter[uVar19] = uVar8;
      iVar17 = iVar17 - (int)(uVar15 & 0xffff);
    }
    else {
      normalizedCounter[uVar19] = -1;
      iVar17 = iVar17 + -1;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 <= maxSymbolValue);
  iVar14 = (int)normalizedCounter[uVar6] >> 1;
  if (iVar14 != -iVar17 && SBORROW4(iVar14,-iVar17) == iVar14 + iVar17 < 0) {
    normalizedCounter[uVar6] = normalizedCounter[uVar6] + (short)iVar17;
    return (ulong)uVar12;
  }
  uVar11 = total * 3 >> (bVar4 + 1 & 0x3f);
  uVar9 = maxSymbolValue + 1;
  uVar13 = (ulong)(maxSymbolValue + 1 + (uint)(uVar9 == 0));
  uVar6 = 0;
  uVar18 = 0;
  do {
    uVar1 = count[uVar6];
    if ((ulong)uVar1 == 0) {
      normalizedCounter[uVar6] = 0;
    }
    else {
      if (uVar5 < uVar1) {
        if ((uint)uVar11 < uVar1) {
          normalizedCounter[uVar6] = -2;
          goto LAB_00154472;
        }
        normalizedCounter[uVar6] = 1;
      }
      else {
        normalizedCounter[uVar6] = -1;
      }
      uVar18 = uVar18 + 1;
      total = total - uVar1;
    }
LAB_00154472:
    uVar6 = uVar6 + 1;
  } while (uVar13 != uVar6);
  uVar5 = iVar16 - uVar18;
  if (uVar5 != 0) {
    if ((uVar11 & 0xffffffff) < total / uVar5) {
      uVar6 = total * 3;
      uVar11 = 0;
      do {
        if ((normalizedCounter[uVar11] == -2) &&
           (uVar1 = count[uVar11], uVar1 <= (uint)(uVar6 / (uVar5 * 2)))) {
          normalizedCounter[uVar11] = 1;
          uVar18 = uVar18 + 1;
          total = total - uVar1;
        }
        uVar11 = uVar11 + 1;
      } while (uVar13 != uVar11);
      uVar5 = iVar16 - uVar18;
    }
    if (uVar18 != uVar9) {
      if (total == 0) {
        uVar6 = 0;
        if (uVar5 != 0) {
          uVar13 = 0;
          do {
            if (0 < normalizedCounter[uVar13]) {
              uVar5 = uVar5 - 1;
              normalizedCounter[uVar13] = normalizedCounter[uVar13] + 1;
            }
            uVar13 = (ulong)((int)uVar13 + 1) % (ulong)uVar9;
          } while (uVar5 != 0);
        }
      }
      else {
        uVar13 = ~(-1L << (cVar3 + 0x3dU & 0x3f));
        uVar6 = ((ulong)uVar5 << (bVar7 & 0x3f)) + uVar13;
        uVar9 = 0;
        bVar10 = true;
        do {
          if (normalizedCounter[uVar9] == -2) {
            uVar11 = uVar13 >> (bVar7 & 0x3f);
            uVar13 = (ulong)count[uVar9] * (uVar6 / total) + uVar13;
            uVar19 = uVar13 >> (bVar7 & 0x3f);
            if (uVar19 == uVar11) break;
            normalizedCounter[uVar9] = (short)uVar19 - (short)uVar11;
          }
          uVar9 = uVar9 + 1;
          bVar10 = uVar9 <= maxSymbolValue;
        } while (uVar9 <= maxSymbolValue);
        uVar6 = -(ulong)bVar10;
      }
      goto LAB_001545cd;
    }
    uVar6 = 0;
    uVar18 = 0;
    uVar9 = 0;
    do {
      if (uVar18 < count[uVar6]) {
        uVar18 = count[uVar6];
        uVar9 = (uint)uVar6;
      }
      uVar6 = uVar6 + 1;
    } while (uVar13 != uVar6);
    normalizedCounter[uVar9] = normalizedCounter[uVar9] + (short)uVar5;
  }
  uVar6 = 0;
LAB_001545cd:
  uVar13 = (ulong)uVar12;
  if (0xffffffffffffff88 < uVar6) {
    uVar13 = uVar6;
  }
  return uVar13;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}